

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,Mask *m)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  ostream *poVar8;
  Long LVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int k;
  ulong uVar13;
  IntVect local_60;
  ostream *local_50;
  int local_44;
  int local_40;
  int local_3c;
  Box *local_38;
  
  uVar1 = (m->super_BaseFab<int>).nvar;
  local_50 = os;
  poVar8 = std::operator<<(os,"(Mask: ");
  local_38 = &(m->super_BaseFab<int>).domain;
  poVar8 = operator<<(poVar8,local_38);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
  std::operator<<(poVar8,"\n");
  local_60.vect[2] = (m->super_BaseFab<int>).domain.smallend.vect[2];
  local_60.vect._0_8_ = *(undefined8 *)(m->super_BaseFab<int>).domain.smallend.vect;
  local_44 = (m->super_BaseFab<int>).domain.bigend.vect[0];
  local_40 = (m->super_BaseFab<int>).domain.bigend.vect[1];
  local_3c = (m->super_BaseFab<int>).domain.bigend.vect[2];
  uVar12 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar12 = 0;
  }
  while ((poVar8 = local_50, local_60.vect[2] <= local_3c &&
         ((local_3c != local_60.vect[2] ||
          ((local_60.vect[1] <= local_40 &&
           ((local_40 != local_60.vect[1] || (local_60.vect[0] <= local_44))))))))) {
    operator<<(local_50,&local_60);
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      poVar8 = std::operator<<(local_50,"  ");
      lVar10 = (long)local_60.vect[0];
      iVar2 = (m->super_BaseFab<int>).domain.smallend.vect[0];
      iVar3 = (m->super_BaseFab<int>).domain.smallend.vect[1];
      iVar4 = (m->super_BaseFab<int>).domain.bigend.vect[0];
      iVar7 = local_60.vect[1] - iVar3;
      iVar11 = local_60.vect[2] - (m->super_BaseFab<int>).domain.smallend.vect[2];
      iVar5 = (m->super_BaseFab<int>).domain.bigend.vect[1];
      piVar6 = (m->super_BaseFab<int>).dptr;
      LVar9 = Box::numPts(local_38);
      std::ostream::operator<<
                (poVar8,piVar6[(lVar10 - iVar2) +
                               (long)((((iVar5 - iVar3) + 1) * iVar11 + iVar7) *
                                     ((iVar4 - iVar2) + 1)) + LVar9 * uVar13]);
    }
    std::operator<<(local_50,"\n");
    iVar2 = local_60.vect[0];
    iVar3 = local_60.vect[1];
    local_60.vect[0] = local_60.vect[0] + 1;
    if ((m->super_BaseFab<int>).domain.bigend.vect[0] <= iVar2) {
      local_60.vect[0] = (m->super_BaseFab<int>).domain.smallend.vect[0];
      local_60.vect[1] = local_60.vect[1] + 1;
      if ((m->super_BaseFab<int>).domain.bigend.vect[1] <= iVar3) {
        local_60.vect[1] = (m->super_BaseFab<int>).domain.smallend.vect[1];
        local_60.vect[2] = local_60.vect[2] + 1;
      }
    }
  }
  std::operator<<(local_50,")\n");
  return poVar8;
}

Assistant:

std::ostream&
operator<< (std::ostream& os,
            const Mask&   m)
{
    int ncomp = m.nComp();

    os << "(Mask: " << m.box() << " " << ncomp << "\n";

    IntVect sm = m.box().smallEnd();
    IntVect bg = m.box().bigEnd();
    for (IntVect p = sm; p <= bg; m.box().next(p))
    {
        os << p;
        for (int k = 0; k < ncomp; k++)
            os << "  " << m(p,k);
        os << "\n";
    }
    os << ")\n";

    BL_ASSERT(os.good());

    return os;
}